

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_qemu_st_i32_m68k
               (TCGContext_conflict2 *tcg_ctx,TCGv_i32 val,TCGv_i32 addr,TCGArg idx,
               MemOp_conflict memop)

{
  TCGOp *pTVar1;
  uint uVar2;
  long extraout_RDX;
  uintptr_t o;
  uint uVar3;
  uintptr_t o_1;
  
  uVar2 = (uint)idx;
  if (1 < (memop & MO_64) - MO_16) {
    if ((memop & MO_64) != MO_8) {
      tcg_gen_qemu_st_i32_m68k_cold_1();
      if ((tcg_ctx->tb_cflags & 0x80000) != 0) {
        pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_mb);
        pTVar1->args[0] = 0x32;
      }
      uVar3 = memop << 4 & 0xffffff70;
      if ((memop & MO_64) != MO_8) {
        uVar3 = memop << 4;
      }
      pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_qemu_ld_i64);
      pTVar1->args[0] = (TCGArg)(val + (long)tcg_ctx);
      pTVar1->args[1] = (long)&tcg_ctx->pool_cur + extraout_RDX;
      pTVar1->args[2] = (ulong)(uVar3 | uVar2);
      check_exit_request_m68k(tcg_ctx);
      return;
    }
    memop = memop & ~MO_BE;
  }
  pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_qemu_st_i32);
  pTVar1->args[0] = (TCGArg)(val + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(addr + (long)tcg_ctx);
  pTVar1->args[2] = (ulong)((memop & 0xffffffb) << 4 | uVar2);
  check_exit_request_m68k(tcg_ctx);
  return;
}

Assistant:

void tcg_gen_qemu_st_i32(TCGContext *tcg_ctx, TCGv_i32 val, TCGv addr, TCGArg idx, MemOp memop)
{
    TCGv_i32 swap = NULL;

    tcg_gen_req_mo(tcg_ctx, TCG_MO_LD_ST | TCG_MO_ST_ST);
    memop = tcg_canonicalize_memop(memop, 0, 1);

#if !TCG_TARGET_HAS_MEMORY_BSWAP
    if (memop & MO_BSWAP) {
        swap = tcg_temp_new_i32(tcg_ctx);
        switch (memop & MO_SIZE) {
        case MO_16:
            tcg_gen_ext16u_i32(tcg_ctx, swap, val);
            tcg_gen_bswap16_i32(tcg_ctx, swap, swap);
            break;
        case MO_32:
            tcg_gen_bswap32_i32(tcg_ctx, swap, val);
            break;
        default:
            g_assert_not_reached();
        }
        val = swap;
        memop &= ~MO_BSWAP;
    }
#endif

    gen_ldst_i32(tcg_ctx, INDEX_op_qemu_st_i32, val, addr, memop, idx);

    if (swap) {
        tcg_temp_free_i32(tcg_ctx, swap);
    }

    check_exit_request(tcg_ctx);
}